

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshManipulator.cpp
# Opt level: O0

SMesh * __thiscall irr::scene::CMeshManipulator::createMeshCopy(CMeshManipulator *this,IMesh *mesh)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *in_RSI;
  u32 i_5;
  u16 *indices_2;
  u32 icount_2;
  u32 i_4;
  S3DVertexTangents *vertices_2;
  u32 vcount_2;
  SMeshBufferTangents *buffer_2;
  u32 i_3;
  u16 *indices_1;
  u32 icount_1;
  u32 i_2;
  S3DVertex2TCoords *vertices_1;
  u32 vcount_1;
  SMeshBufferLightMap *buffer_1;
  u32 i_1;
  u16 *indices;
  u32 icount;
  u32 i;
  S3DVertex *vertices;
  u32 vcount;
  SMeshBuffer *buffer;
  IMeshBuffer *mb;
  u32 b;
  u32 meshBufferCount;
  SMesh *clone;
  S3DVertexTangents *in_stack_ffffffffffffff18;
  CMeshBuffer<irr::video::S3DVertex> *in_stack_ffffffffffffff20;
  SMaterial *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint local_bc;
  uint local_ac;
  uint local_8c;
  uint local_7c;
  uint local_5c;
  uint local_4c;
  uint local_28;
  SMesh *local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (SMesh *)0x0;
  }
  else {
    local_8 = (SMesh *)operator_new(0x58);
    SMesh::SMesh((SMesh *)in_stack_ffffffffffffff20);
    uVar2 = (**(code **)*in_RSI)();
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      plVar5 = (long *)(**(code **)(*in_RSI + 8))(in_RSI,local_28);
      iVar3 = (**(code **)(*plVar5 + 0x10))();
      if (iVar3 == 0) {
        in_stack_ffffffffffffff28 = (SMaterial *)operator_new(0x150);
        CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(in_stack_ffffffffffffff20);
        (**(code **)(*plVar5 + 8))();
        video::SMaterial::operator=
                  ((SMaterial *)CONCAT44(iVar3,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28)
        ;
        uVar4 = (**(code **)(*plVar5 + 0x28))();
        core::array<irr::video::S3DVertex>::reallocate
                  ((array<irr::video::S3DVertex> *)CONCAT44(iVar3,in_stack_ffffffffffffff30),
                   (u32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
        (**(code **)(*plVar5 + 0x18))();
        for (local_4c = 0; local_4c < uVar4; local_4c = local_4c + 1) {
          core::array<irr::video::S3DVertex>::push_back
                    ((array<irr::video::S3DVertex> *)in_stack_ffffffffffffff20,
                     &in_stack_ffffffffffffff18->super_S3DVertex);
        }
        uVar4 = (**(code **)(*plVar5 + 0x48))();
        core::array<unsigned_short>::reallocate
                  ((array<unsigned_short> *)CONCAT44(iVar3,in_stack_ffffffffffffff30),
                   (u32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
        (**(code **)(*plVar5 + 0x38))();
        for (local_5c = 0; local_5c < uVar4; local_5c = local_5c + 1) {
          core::array<unsigned_short>::push_back
                    ((array<unsigned_short> *)in_stack_ffffffffffffff20,
                     (unsigned_short *)in_stack_ffffffffffffff18);
        }
        SMesh::addMeshBuffer
                  ((SMesh *)in_stack_ffffffffffffff20,(IMeshBuffer *)in_stack_ffffffffffffff18);
        IReferenceCounted::drop((IReferenceCounted *)in_stack_ffffffffffffff18);
      }
      else if (iVar3 == 1) {
        in_stack_ffffffffffffff20 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
        CMeshBuffer<irr::video::S3DVertex2TCoords>::CMeshBuffer
                  ((CMeshBuffer<irr::video::S3DVertex2TCoords> *)in_stack_ffffffffffffff20);
        (**(code **)(*plVar5 + 8))();
        video::SMaterial::operator=
                  ((SMaterial *)CONCAT44(iVar3,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28)
        ;
        uVar4 = (**(code **)(*plVar5 + 0x28))();
        core::array<irr::video::S3DVertex2TCoords>::reallocate
                  ((array<irr::video::S3DVertex2TCoords> *)CONCAT44(iVar3,in_stack_ffffffffffffff30)
                   ,(u32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
        (**(code **)(*plVar5 + 0x18))();
        for (local_7c = 0; local_7c < uVar4; local_7c = local_7c + 1) {
          core::array<irr::video::S3DVertex2TCoords>::push_back
                    ((array<irr::video::S3DVertex2TCoords> *)in_stack_ffffffffffffff20,
                     (S3DVertex2TCoords *)in_stack_ffffffffffffff18);
        }
        uVar4 = (**(code **)(*plVar5 + 0x48))();
        core::array<unsigned_short>::reallocate
                  ((array<unsigned_short> *)CONCAT44(iVar3,in_stack_ffffffffffffff30),
                   (u32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
        (**(code **)(*plVar5 + 0x38))();
        for (local_8c = 0; local_8c < uVar4; local_8c = local_8c + 1) {
          core::array<unsigned_short>::push_back
                    ((array<unsigned_short> *)in_stack_ffffffffffffff20,
                     (unsigned_short *)in_stack_ffffffffffffff18);
        }
        SMesh::addMeshBuffer
                  ((SMesh *)in_stack_ffffffffffffff20,(IMeshBuffer *)in_stack_ffffffffffffff18);
        IReferenceCounted::drop((IReferenceCounted *)in_stack_ffffffffffffff18);
      }
      else if (iVar3 == 2) {
        in_stack_ffffffffffffff18 = (S3DVertexTangents *)operator_new(0x150);
        CMeshBuffer<irr::video::S3DVertexTangents>::CMeshBuffer
                  ((CMeshBuffer<irr::video::S3DVertexTangents> *)in_stack_ffffffffffffff20);
        (**(code **)(*plVar5 + 8))();
        video::SMaterial::operator=
                  ((SMaterial *)CONCAT44(iVar3,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28)
        ;
        uVar4 = (**(code **)(*plVar5 + 0x28))();
        core::array<irr::video::S3DVertexTangents>::reallocate
                  ((array<irr::video::S3DVertexTangents> *)CONCAT44(iVar3,in_stack_ffffffffffffff30)
                   ,(u32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
        (**(code **)(*plVar5 + 0x18))();
        for (local_ac = 0; local_ac < uVar4; local_ac = local_ac + 1) {
          core::array<irr::video::S3DVertexTangents>::push_back
                    ((array<irr::video::S3DVertexTangents> *)in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff18);
        }
        uVar4 = (**(code **)(*plVar5 + 0x48))();
        core::array<unsigned_short>::reallocate
                  ((array<unsigned_short> *)CONCAT44(iVar3,in_stack_ffffffffffffff30),
                   (u32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
        (**(code **)(*plVar5 + 0x38))();
        for (local_bc = 0; local_bc < uVar4; local_bc = local_bc + 1) {
          core::array<unsigned_short>::push_back
                    ((array<unsigned_short> *)in_stack_ffffffffffffff20,
                     (unsigned_short *)in_stack_ffffffffffffff18);
        }
        SMesh::addMeshBuffer
                  ((SMesh *)in_stack_ffffffffffffff20,(IMeshBuffer *)in_stack_ffffffffffffff18);
        IReferenceCounted::drop((IReferenceCounted *)in_stack_ffffffffffffff18);
      }
    }
    puVar6 = (undefined8 *)(**(code **)(*in_RSI + 0x18))();
    uVar1 = *puVar6;
    (local_8->BoundingBox).MinEdge.X = (float)(int)uVar1;
    (local_8->BoundingBox).MinEdge.Y = (float)(int)((ulong)uVar1 >> 0x20);
    *(undefined8 *)&(local_8->BoundingBox).MinEdge.Z = puVar6[1];
    uVar1 = puVar6[2];
    (local_8->BoundingBox).MaxEdge.Y = (float)(int)uVar1;
    (local_8->BoundingBox).MaxEdge.Z = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return local_8;
}

Assistant:

SMesh *CMeshManipulator::createMeshCopy(scene::IMesh *mesh) const
{
	if (!mesh)
		return 0;

	SMesh *clone = new SMesh();

	const u32 meshBufferCount = mesh->getMeshBufferCount();

	for (u32 b = 0; b < meshBufferCount; ++b) {
		const IMeshBuffer *const mb = mesh->getMeshBuffer(b);
		switch (mb->getVertexType()) {
		case video::EVT_STANDARD: {
			SMeshBuffer *buffer = new SMeshBuffer();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertex *vertices = (video::S3DVertex *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		case video::EVT_2TCOORDS: {
			SMeshBufferLightMap *buffer = new SMeshBufferLightMap();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertex2TCoords *vertices = (video::S3DVertex2TCoords *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		case video::EVT_TANGENTS: {
			SMeshBufferTangents *buffer = new SMeshBufferTangents();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertexTangents *vertices = (video::S3DVertexTangents *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		} // end switch

	} // end for all mesh buffers

	clone->BoundingBox = mesh->getBoundingBox();
	return clone;
}